

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O3

SUNErrCode
SUNHashMap_New(int64_t capacity,_func_SUNErrCode_SUNHashMapKeyValue_ptr *destroyKeyValue,
              SUNHashMap *map)

{
  SUNHashMap __ptr;
  SUNStlVector_SUNHashMapKeyValue pSVar1;
  SUNHashMapKeyValue *__ptr_00;
  long lVar2;
  long lVar3;
  long lVar4;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  
  if (capacity < 1) {
    return -0x270d;
  }
  __ptr = (SUNHashMap)malloc(0x10);
  *map = __ptr;
  if ((destroyKeyValue != (_func_SUNErrCode_SUNHashMapKeyValue_ptr *)0x0) &&
     (pSVar1 = (SUNStlVector_SUNHashMapKeyValue)malloc(0x20),
     pSVar1 != (SUNStlVector_SUNHashMapKeyValue)0x0)) {
    __ptr_00 = (SUNHashMapKeyValue *)malloc(capacity * 8);
    pSVar1->values = __ptr_00;
    if (__ptr_00 != (SUNHashMapKeyValue *)0x0) {
      pSVar1->size = 0;
      pSVar1->capacity = capacity;
      pSVar1->destroyValue = destroyKeyValue;
      lVar4 = 0;
      lVar3 = capacity;
      do {
        lVar5 = in_ST0;
        if (lVar4 == lVar3) {
          if (lVar3 == 0) {
            lVar2 = 2;
          }
          else {
            lVar5 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            in_ST5 = in_ST6;
            ceill();
            lVar2 = (long)ROUND(in_ST0);
            in_ST0 = lVar5;
            if (lVar2 <= lVar3) goto LAB_0010a622;
          }
          __ptr_00 = (SUNHashMapKeyValue *)realloc(__ptr_00,lVar2 * 8);
          if (__ptr_00 == (SUNHashMapKeyValue *)0x0) {
            return -0x2704;
          }
          pSVar1->values = __ptr_00;
          pSVar1->capacity = lVar2;
          lVar3 = lVar2;
          lVar5 = in_ST0;
        }
LAB_0010a622:
        __ptr_00[lVar4] = (SUNHashMapKeyValue)0x0;
        lVar4 = lVar4 + 1;
        pSVar1->size = lVar4;
        in_ST0 = lVar5;
        if (capacity == lVar4) {
          (*map)->buckets = pSVar1;
          return 0;
        }
      } while( true );
    }
  }
  free(__ptr);
  return -0x2704;
}

Assistant:

SUNErrCode SUNHashMap_New(int64_t capacity,
                          SUNErrCode (*destroyKeyValue)(SUNHashMapKeyValue* kv_ptr),
                          SUNHashMap* map)
{
  if (capacity <= 0) { return SUN_ERR_ARG_OUTOFRANGE; }

  *map = NULL;
  *map = (SUNHashMap)malloc(sizeof(**map));

  if (!map) { return SUN_ERR_MALLOC_FAIL; }

  SUNStlVector_SUNHashMapKeyValue buckets =
    SUNStlVector_SUNHashMapKeyValue_New(capacity, destroyKeyValue);
  if (!buckets)
  {
    free(*map);
    return SUN_ERR_MALLOC_FAIL;
  }

  /* Initialize all buckets to NULL */
  for (int64_t i = 0; i < capacity; i++)
  {
    SUNErrCode err = SUNStlVector_SUNHashMapKeyValue_PushBack(buckets, NULL);
    if (err) { return err; };
  }

  (*map)->buckets = buckets;

  return SUN_SUCCESS;
}